

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_future.cpp
# Opt level: O2

void __thiscall
Omega_h::Future<signed_char>::Future
          (Future<signed_char> *this,Read<signed_char> *sendbuf,Write<signed_char> *recvbuf,
          requests_type *requests,callback_type *callback)

{
  Write<signed_char>::Write((Write<signed_char> *)this,&sendbuf->write_);
  Write<signed_char>::Write(&this->recvbuf_,recvbuf);
  std::function<Omega_h::Read<signed_char>_(Omega_h::Write<signed_char>)>::function
            (&this->callback_,callback);
  std::vector<int,_std::allocator<int>_>::vector(&this->requests_,requests);
  this->status_ = waiting;
  return;
}

Assistant:

Future<T>::Future(Read<T> sendbuf, Write<T> recvbuf,
    const requests_type&& requests, const callback_type callback)
    : sendbuf_(sendbuf),
      recvbuf_(recvbuf),
      callback_(callback),
      requests_(requests),
      status_(Status::waiting) {}